

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_mem clCreatePipe(cl_context context,cl_mem_flags flags,cl_uint pipe_packet_size,
                   cl_uint pipe_max_packets,cl_pipe_properties *properties,cl_int *errcode_ret)

{
  uint64_t enqueueCounter_00;
  CLIntercept *this;
  cl_context p_Var1;
  bool bVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  undefined8 uVar5;
  cl_mem p_Var6;
  string *psVar7;
  cl_uint in_ECX;
  cl_uint in_EDX;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  cl_context in_RDI;
  cl_pipe_properties *in_R8;
  int *in_R9;
  cl_int in_stack_000000a4;
  char *in_stack_000000a8;
  CLIntercept *in_stack_000000b0;
  cl_mem retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  cl_uint in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  CObjectTracker *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  CEnumNameMap *in_stack_fffffffffffffef8;
  cl_sync_point_khr *in_stack_ffffffffffffff00;
  cl_event *in_stack_ffffffffffffff08;
  string local_f0 [4];
  cl_int in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  CLIntercept *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2f;
  string *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  CLIntercept *in_stack_ffffffffffffff40;
  time_point in_stack_ffffffffffffff48;
  time_point in_stack_ffffffffffffff50;
  time_point in_stack_ffffffffffffff58;
  time_point in_stack_ffffffffffffff60;
  char *local_78;
  int local_70 [4];
  string local_60 [32];
  uint64_t local_40;
  CLIntercept *local_38;
  int *local_30;
  cl_pipe_properties *local_28;
  cl_uint local_20;
  cl_uint local_1c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_18;
  cl_context local_10;
  cl_mem local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(local_38), pcVar3->clCreatePipe == (cl_api_clCreatePipe)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffef4)
    ;
    if (local_30 != (int *)0x0) {
      *local_30 = -0x22;
    }
    local_8 = (cl_mem)0x0;
  }
  else {
    local_40 = CLIntercept::getEnqueueCounter
                         ((CLIntercept *)
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    pSVar4 = CLIntercept::config(local_38);
    p_Var1 = local_10;
    this = local_38;
    enqueueCounter_00 = local_40;
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::enumName(local_38);
      CEnumNameMap::name_mem_flags_abi_cxx11_
                (in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      uVar5 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffe90 = local_18;
      in_stack_fffffffffffffea0 = local_20;
      CLIntercept::callLoggingEnter
                (this,"clCreatePipe",enqueueCounter_00,(cl_kernel)0x0,
                 "context = %p, flags = %s (%llX), pipe_packet_size = %u, pipe_max_packets = %u",
                 p_Var1,uVar5,local_18,local_1c);
      std::__cxx11::string::~string(local_60);
    }
    local_70[0] = 0;
    pSVar4 = CLIntercept::config(local_38);
    if ((((((pSVar4->CallLogging & 1U) != 0) ||
          (pSVar4 = CLIntercept::config(local_38), (pSVar4->ErrorLogging & 1U) != 0)) ||
         (pSVar4 = CLIntercept::config(local_38), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_38), (pSVar4->NoErrors & 1U) != 0)) &&
       (local_30 == (int *)0x0)) {
      local_30 = local_70;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe90);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe90);
    pSVar4 = CLIntercept::config(local_38);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_38), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      local_78 = (char *)std::chrono::_V2::steady_clock::now();
    }
    pcVar3 = CLIntercept::dispatch(local_38);
    p_Var6 = (*pcVar3->clCreatePipe)
                       (local_10,(cl_mem_flags)local_18,local_1c,local_20,local_28,local_30);
    pSVar4 = CLIntercept::config(local_38);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_38), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      psVar7 = (string *)std::chrono::_V2::steady_clock::now();
      pSVar4 = CLIntercept::config(local_38);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_40), bVar2)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff48,"",(allocator *)&stack0xffffffffffffff47);
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff50.__d.__r,
                   (char *)in_stack_ffffffffffffff48.__d.__r,(string *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
        in_stack_ffffffffffffff30 = psVar7;
        in_stack_ffffffffffffff38 = local_78;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_38), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_38), (pSVar4->NoErrors & 1U) != 0)) && (*local_30 != 0))
    {
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
      }
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->NoErrors & 1U) != 0) {
        *local_30 = 0;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if ((pSVar4->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(local_38);
      CObjectTracker::AddAllocation<_cl_mem*>
                (in_stack_fffffffffffffea8,
                 (_cl_mem *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    pSVar4 = CLIntercept::config(local_38);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    }
    pSVar4 = CLIntercept::config(local_38);
    local_8 = p_Var6;
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"",(allocator *)&stack0xffffffffffffff0f);
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 (bool)in_stack_ffffffffffffff2f,(uint64_t)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
    }
  }
  return local_8;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreatePipe) (
    cl_context context,
    cl_mem_flags flags,
    cl_uint pipe_packet_size,
    cl_uint pipe_max_packets,
    const cl_pipe_properties* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreatePipe )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), pipe_packet_size = %u, pipe_max_packets = %u",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags,
            pipe_packet_size,
            pipe_max_packets );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreatePipe(
            context,
            flags,
            pipe_packet_size,
            pipe_max_packets,
            properties,
            errcode_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0] );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}